

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCtxFormat::emulate_mthd(MthdCtxFormat *this)

{
  pgraph_state *state;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val & 3;
  uVar2 = 0;
  if (uVar1 == 1) {
    uVar3 = (this->super_SingleMthdTest).super_MthdTest.cls;
    uVar2 = 0xb;
    if (uVar3 != 0x44) {
      uVar2 = (uint)(uVar3 == 0x57) * 9 + 2;
    }
  }
  uVar3 = 8;
  if (uVar1 != 2) {
    uVar3 = uVar2;
  }
  uVar2 = 0xd;
  if (uVar1 != 3) {
    uVar2 = uVar3;
  }
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_grobj_set_color_format(state,(this->super_SingleMthdTest).super_MthdTest.egrobj,uVar2);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  if ((uVar2 == 0x57) ||
     ((uVar2 == 0x17 &&
      (0x3f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
              super_Test.chipset.card_type)))) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
    uVar2 = pgraph_grobj_get_color_format(state);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         uVar2 << 0x18 | uVar1 & 0xffffff;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  if (uVar2 == 0x18) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40) goto LAB_001bf525;
  }
  else if (uVar2 != 0x44) {
    if (uVar2 == 0x57) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
           (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) << 0x10 |
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xfffdffff) ^
           0x20000;
    }
    goto LAB_001bf525;
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
  uVar2 = pgraph_grobj_get_color_format(state);
  uVar4 = (uVar2 & 0xff) << 8;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
       uVar4 | uVar1 & 0xffff00ff;
  uVar2 = pgraph_grobj_get_color_format(state);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
       (uVar2 & 0xff) << 0x10 | uVar4 | uVar1 & 0xff0000ff;
LAB_001bf525:
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x44) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
         (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) << 0x13 |
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xffefffff) ^
         0x100000;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		int sfmt = val & 3;
		int fmt = 0;
		if (sfmt == 1) {
			if (cls == 0x44 || cls == 0x57)
				fmt = 0xb;
			else
				fmt = 0x2;
		}
		if (sfmt == 2)
			fmt = 0x8;
		if (sfmt == 3)
			fmt = 0xd;
		pgraph_grobj_set_color_format(&exp, egrobj, fmt);
		if (cls == 0x57 || (cls == 0x17 && chipset.card_type >= 0x40)) {
			insrt(exp.ctx_format, 24, 8, pgraph_grobj_get_color_format(&exp));
		}
		if (cls == 0x57) {
			insrt(exp.ctx_valid, 17, 1, !extr(exp.nsource, 1, 1));
		}
		if (cls == 0x44 || (cls == 0x18 && chipset.card_type >= 0x40)) {
			insrt(exp.ctx_format, 8, 8, pgraph_grobj_get_color_format(&exp));
			insrt(exp.ctx_format, 16, 8, pgraph_grobj_get_color_format(&exp));
		}
		if (cls == 0x44) {
			insrt(exp.ctx_valid, 20, 1, !extr(exp.nsource, 1, 1));
		}
	}